

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touch.cpp
# Opt level: O2

bool fs_touch(string_view path)

{
  bool bVar1;
  bool bVar2;
  string_view fname;
  ofstream f;
  byte abStack_200 [480];
  
  bVar1 = fs_set_modtime(path,true);
  bVar2 = true;
  if (!bVar1) {
    std::ofstream::ofstream(&f,path._M_str,_S_out);
    if ((abStack_200[*(long *)(_f + -0x18)] & 5) == 0) {
      std::ofstream::close();
      std::ofstream::~ofstream(&f);
    }
    else {
      std::ofstream::~ofstream(&f);
      fname._M_str = "fs_touch";
      fname._M_len = 8;
      fs_print_error(path,fname);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool fs_touch(std::string_view path)
{
  if(fs_set_modtime(path, true))
    return true;

  if(std::ofstream f(path.data()); f){
    f.close();
    return true;
  }

  fs_print_error(path, __func__);
  return false;
}